

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

bool __thiscall
JsUtil::
BaseDictionary<JsUtil::Pair<unsigned_int,int,DefaultComparer>,PropertySym*,Memory::JitArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::TryGetValue<JsUtil::Pair<unsigned_int,int,DefaultComparer>>
          (BaseDictionary<JsUtil::Pair<unsigned_int,int,DefaultComparer>,PropertySym*,Memory::JitArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,Pair<unsigned_int,_int,_DefaultComparer> *key,PropertySym **value)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  hash_t hVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  uint depth;
  undefined1 auVar9 [16];
  ulong uVar8;
  
  lVar5 = *(long *)this;
  depth = 0;
  if (lVar5 != 0) {
    hVar4 = PrimePolicy::ModPrime
                      (key->second + key->first & 0x7fffffff,*(uint *)(this + 0x1c),
                       *(int *)(this + 0x2c));
    uVar6 = *(uint *)(lVar5 + (ulong)hVar4 * 4);
    depth = 0;
    if (-1 < (int)uVar6) {
      lVar5 = *(long *)(this + 8);
      uVar1 = key->first;
      uVar3 = key->second;
      depth = 0;
      do {
        uVar8 = (ulong)uVar6;
        uVar2 = *(undefined8 *)(lVar5 + 0xc + uVar8 * 0x18);
        auVar9._0_4_ = -(uint)((int)uVar2 == uVar1);
        auVar9._4_4_ = -(uint)((int)((ulong)uVar2 >> 0x20) == uVar3);
        auVar9._8_4_ = 0xffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar9 = pmovsxdq(auVar9,auVar9);
        iVar7 = movmskpd(uVar6,auVar9);
        if (iVar7 == 3) {
          if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
            DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),depth);
            lVar5 = *(long *)(this + 8);
          }
          *value = *(PropertySym **)(lVar5 + uVar8 * 0x18);
          return true;
        }
        depth = depth + 1;
        uVar6 = *(uint *)(lVar5 + uVar8 * 0x18 + 8);
      } while (-1 < (int)uVar6);
    }
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),depth);
  }
  return false;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }